

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cpp
# Opt level: O0

deque<Patch,_std::allocator<Patch>_> * __thiscall
diff_match_patch::patch_deepCopy
          (deque<Patch,_std::allocator<Patch>_> *__return_storage_ptr__,diff_match_patch *this,
          deque<Patch,_std::allocator<Patch>_> *patches)

{
  undefined8 this_00;
  bool bVar1;
  undefined1 local_160 [8];
  Diff diffCopy;
  Diff *aDiff;
  const_iterator __end2;
  const_iterator __begin2;
  deque<Diff,_std::allocator<Diff>_> *__range2;
  undefined1 local_d8 [8];
  Patch patchCopy;
  Patch *aPatch;
  iterator __end1;
  iterator __begin1;
  deque<Patch,_std::allocator<Patch>_> *__range1;
  deque<Patch,_std::allocator<Patch>_> *patches_local;
  diff_match_patch *this_local;
  deque<Patch,_std::allocator<Patch>_> *patchesCopy;
  
  std::deque<Patch,_std::allocator<Patch>_>::deque(__return_storage_ptr__);
  std::deque<Patch,_std::allocator<Patch>_>::begin((iterator *)&__end1._M_node,patches);
  std::deque<Patch,_std::allocator<Patch>_>::end((iterator *)&aPatch,patches);
  while (bVar1 = std::operator!=((_Self *)&__end1._M_node,(_Self *)&aPatch), bVar1) {
    patchCopy._88_8_ =
         std::_Deque_iterator<Patch,_Patch_&,_Patch_*>::operator*
                   ((_Deque_iterator<Patch,_Patch_&,_Patch_*> *)&__end1._M_node);
    Patch::Patch((Patch *)local_d8);
    this_00 = patchCopy._88_8_;
    std::deque<Diff,_std::allocator<Diff>_>::begin
              ((const_iterator *)&__end2._M_node,
               (deque<Diff,_std::allocator<Diff>_> *)patchCopy._88_8_);
    std::deque<Diff,_std::allocator<Diff>_>::end
              ((const_iterator *)&aDiff,(deque<Diff,_std::allocator<Diff>_> *)this_00);
    while (bVar1 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&aDiff), bVar1) {
      diffCopy.text.field_2._8_8_ =
           std::_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*>::operator*
                     ((_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*> *)&__end2._M_node);
      Diff::Diff((Diff *)local_160,((reference)diffCopy.text.field_2._8_8_)->operation,
                 &((reference)diffCopy.text.field_2._8_8_)->text);
      std::deque<Diff,_std::allocator<Diff>_>::push_back
                ((deque<Diff,_std::allocator<Diff>_> *)local_d8,(value_type *)local_160);
      Diff::~Diff((Diff *)local_160);
      std::_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*>::operator++
                ((_Deque_iterator<Diff,_const_Diff_&,_const_Diff_*> *)&__end2._M_node);
    }
    patchCopy.diffs.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_node._0_4_ = *(undefined4 *)(patchCopy._88_8_ + 0x50);
    patchCopy.diffs.super__Deque_base<Diff,_std::allocator<Diff>_>._M_impl.super__Deque_impl_data.
    _M_finish._M_node._4_4_ = *(undefined4 *)(patchCopy._88_8_ + 0x54);
    patchCopy.start1 = *(int *)(patchCopy._88_8_ + 0x58);
    patchCopy.start2 = *(int *)(patchCopy._88_8_ + 0x5c);
    std::deque<Patch,_std::allocator<Patch>_>::push_back
              (__return_storage_ptr__,(value_type *)local_d8);
    Patch::~Patch((Patch *)local_d8);
    std::_Deque_iterator<Patch,_Patch_&,_Patch_*>::operator++
              ((_Deque_iterator<Patch,_Patch_&,_Patch_*> *)&__end1._M_node);
  }
  return __return_storage_ptr__;
}

Assistant:

std::deque<Patch> diff_match_patch::patch_deepCopy(std::deque<Patch> &patches) {
  std::deque<Patch> patchesCopy;
  for (const Patch& aPatch : patches) {
    Patch patchCopy = Patch();
    for (const Diff& aDiff : aPatch.diffs) {
      Diff diffCopy = Diff(aDiff.operation, aDiff.text);
      patchCopy.diffs.push_back(diffCopy);
    }
    patchCopy.start1 = aPatch.start1;
    patchCopy.start2 = aPatch.start2;
    patchCopy.length1 = aPatch.length1;
    patchCopy.length2 = aPatch.length2;
    patchesCopy.push_back(patchCopy);
  }
  return patchesCopy;
}